

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

CMbuffer cm_create_transport_and_link_buffer(CManager_conflict cm,void *buffer,ssize_t length)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  CMbuffer p_Var3;
  pthread_t pVar4;
  timespec ts;
  timespec local_30;
  
  p_Var3 = (CMbuffer)INT_CMmalloc(0x30);
  p_Var3->buffer = (void *)0x0;
  p_Var3->size = 0;
  *(undefined8 *)&p_Var3->ref_count = 0;
  p_Var3->next = (_CMbuffer *)0x0;
  p_Var3->return_callback = (_func_void_void_ptr *)0x0;
  p_Var3->return_callback_data = (void *)0x0;
  p_Var3->buffer = buffer;
  p_Var3->size = length;
  p_Var3->ref_count = 1;
  iVar1 = CMtrace_val[9];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(cm,CMBufferVerbose);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      __stream = (FILE *)cm->CMTrace_file;
      _Var2 = getpid();
      pVar4 = pthread_self();
      fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_30);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_30.tv_sec,local_30.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"Create and link buffer %p, ref_count is %d\n",p_Var3,
            (ulong)(uint)p_Var3->ref_count);
  }
  fflush((FILE *)cm->CMTrace_file);
  p_Var3->next = cm->cm_buffer_list;
  cm->cm_buffer_list = p_Var3;
  return p_Var3;
}

Assistant:

extern CMbuffer
 cm_create_transport_and_link_buffer(CManager cm, void *buffer, ssize_t length)
 {
     CMbuffer tmp;
     tmp = INT_CMmalloc(sizeof(*tmp));
     memset(tmp, 0, sizeof(*tmp));
     tmp->buffer = buffer;
     tmp->size = length;
     tmp->ref_count = 1;
     CMtrace_out(cm, CMBufferVerbose, "Create and link buffer %p, ref_count is %d\n", tmp, tmp->ref_count);
     tmp->next = cm->cm_buffer_list;
     cm->cm_buffer_list = tmp;
     return tmp;
 }